

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

double __thiscall NEST::NESTcalc::NexONi(NESTcalc *this,double energy,double density)

{
  bool bVar1;
  double dVar2;
  Wvalue WVar3;
  double alpha;
  Wvalue wvalue;
  double density_local;
  double energy_local;
  NESTcalc *this_local;
  
  bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (bVar1) {
    this_local = (NESTcalc *)0x3fcae147ae147ae1;
  }
  else {
    dVar2 = VDetector::get_molarMass(this->fdetector);
    bVar1 = VDetector::get_OldW13eV(this->fdetector);
    WVar3 = WorkFunction(density,dVar2,bVar1);
    wvalue.Wq_eV = WVar3.alpha;
    dVar2 = erf(energy * 0.05);
    this_local = (NESTcalc *)(wvalue.Wq_eV * dVar2);
  }
  return (double)this_local;
}

Assistant:

double NESTcalc::NexONi(double energy, double density) {
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.))
    return 0.21;  // https://arxiv.org/pdf/1903.05815.pdf
  Wvalue wvalue = WorkFunction(density, fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  double alpha = wvalue.alpha;
  return alpha * erf(0.05 * energy);
}